

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Model>
               (Model *model,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prop_names,bool attr_prop,bool rel_prop)

{
  _Base_ptr p_Var1;
  
  if (prop_names !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    for (p_Var1 = (model->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(model->props)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
      if (((ulong)p_Var1[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000 || attr_prop) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(prop_names,(value_type *)(p_Var1 + 1));
      }
    }
  }
  return prop_names !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
}

Assistant:

bool GetPrimPropertyNamesImpl(const Model &model,
                              std::vector<std::string> *prop_names,
                              bool attr_prop, bool rel_prop) {
  if (!prop_names) {
    return false;
  }

  // TODO: Use propertyNames()
  for (const auto &prop : model.props) {
    if (prop.second.is_relationship()) {
      if (rel_prop) {
        prop_names->push_back(prop.first);
      }
    } else {  // assume attribute
      if (attr_prop) {
        prop_names->push_back(prop.first);
      }
    }
  }

  return true;
}